

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O2

void example_class_import_wrap(ExampleClass *self,object *py_buffer)

{
  stl_input_iterator<char> end;
  stl_input_iterator<char> begin;
  vector<char,_std::allocator<char>_> buffer;
  allocator_type local_61;
  stl_input_iterator_impl local_60;
  stl_input_iterator_impl local_50;
  stl_input_iterator_impl local_40;
  stl_input_iterator_impl local_30;
  _Vector_base<char,_std::allocator<char>_> local_20;
  
  boost::python::objects::stl_input_iterator_impl::stl_input_iterator_impl(&local_40,py_buffer);
  boost::python::objects::stl_input_iterator_impl::stl_input_iterator_impl(&local_50);
  *(long *)local_40.it_.super_object_base.m_ptr = *(long *)local_40.it_.super_object_base.m_ptr + 1;
  local_60.it_.super_object_base.m_ptr = local_40.it_.super_object_base.m_ptr;
  if (local_40.ob_.m_p != (_object *)0x0) {
    (local_40.ob_.m_p)->ob_refcnt = (local_40.ob_.m_p)->ob_refcnt + 1;
  }
  local_60.ob_.m_p = local_40.ob_.m_p;
  *(long *)local_50.it_.super_object_base.m_ptr = *(long *)local_50.it_.super_object_base.m_ptr + 1;
  local_30.it_.super_object_base.m_ptr = local_50.it_.super_object_base.m_ptr;
  if (local_50.ob_.m_p != (_object *)0x0) {
    (local_50.ob_.m_p)->ob_refcnt = (local_50.ob_.m_p)->ob_refcnt + 1;
  }
  local_30.ob_.m_p = local_50.ob_.m_p;
  std::vector<char,std::allocator<char>>::vector<boost::python::stl_input_iterator<char>,void>
            ((vector<char,std::allocator<char>> *)&local_20,(stl_input_iterator<char> *)&local_60,
             (stl_input_iterator<char> *)&local_30,&local_61);
  boost::python::objects::stl_input_iterator_impl::~stl_input_iterator_impl(&local_30);
  boost::python::objects::stl_input_iterator_impl::~stl_input_iterator_impl(&local_60);
  ExampleClass::import
            (self,(uchar *)local_20._M_impl.super__Vector_impl_data._M_start,
             (int)local_20._M_impl.super__Vector_impl_data._M_finish -
             (int)local_20._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_20);
  boost::python::objects::stl_input_iterator_impl::~stl_input_iterator_impl(&local_50);
  boost::python::objects::stl_input_iterator_impl::~stl_input_iterator_impl(&local_40);
  return;
}

Assistant:

void example_class_import_wrap(ExampleClass& self, boost::python::object py_buffer)
{
  namespace python = boost::python;
  python::stl_input_iterator<char> begin(py_buffer), end;
  
  // Copy the py_buffer into a local buffer with known continguous memory.
  std::vector<char> buffer(begin, end);

  // Cast and delegate to the printBuffer member function.
  self.import(reinterpret_cast<unsigned char*>(&buffer[0]), buffer.size());
}